

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger get_slice_params(HSQUIRRELVM v,SQInteger *sidx,SQInteger *eidx,SQObjectPtr *o)

{
  SQInteger SVar1;
  SQObjectPtr *pSVar2;
  SQObjectValue local_50;
  SQObjectValue local_48;
  SQObjectPtr *end;
  SQObjectPtr *start;
  SQInteger top;
  SQObjectPtr *o_local;
  SQInteger *eidx_local;
  SQInteger *sidx_local;
  HSQUIRRELVM v_local;
  
  SVar1 = sq_gettop(v);
  *sidx = 0;
  *eidx = 0;
  pSVar2 = stack_get(v,1);
  SQObjectPtr::operator=(o,pSVar2);
  if (((1 < SVar1) && (pSVar2 = stack_get(v,2), (pSVar2->super_SQObject)._type != OT_NULL)) &&
     (((pSVar2->super_SQObject)._type & 0x4000000) != 0)) {
    if ((pSVar2->super_SQObject)._type == OT_FLOAT) {
      local_48.nInteger = (SQInteger)(pSVar2->super_SQObject)._unVal.fFloat;
    }
    else {
      local_48 = (pSVar2->super_SQObject)._unVal;
    }
    *sidx = (SQInteger)local_48;
  }
  if (SVar1 < 3) {
    SVar1 = sq_getsize(v,1);
    *eidx = SVar1;
  }
  else {
    pSVar2 = stack_get(v,3);
    if (((pSVar2->super_SQObject)._type & 0x4000000) != 0) {
      if ((pSVar2->super_SQObject)._type == OT_FLOAT) {
        local_50.nInteger = (SQInteger)(pSVar2->super_SQObject)._unVal.fFloat;
      }
      else {
        local_50 = (pSVar2->super_SQObject)._unVal;
      }
      *eidx = (SQInteger)local_50;
    }
  }
  return 1;
}

Assistant:

static SQInteger get_slice_params(HSQUIRRELVM v,SQInteger &sidx,SQInteger &eidx,SQObjectPtr &o)
{
    SQInteger top = sq_gettop(v);
    sidx=0;
    eidx=0;
    o=stack_get(v,1);
    if(top>1){
        SQObjectPtr &start=stack_get(v,2);
        if(type(start)!=OT_NULL && sq_isnumeric(start)){
            sidx=tointeger(start);
        }
    }
    if(top>2){
        SQObjectPtr &end=stack_get(v,3);
        if(sq_isnumeric(end)){
            eidx=tointeger(end);
        }
    }
    else {
        eidx = sq_getsize(v,1);
    }
    return 1;
}